

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::variable_decl_function_local_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *var)

{
  StorageClass SVar1;
  
  SVar1 = var->storage;
  var->storage = StorageClassFunction;
  (*(this->super_Compiler)._vptr_Compiler[0x24])();
  var->storage = SVar1;
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::variable_decl_function_local(SPIRVariable &var)
{
	// These variables are always function local,
	// so make sure we emit the variable without storage qualifiers.
	// Some backends will inject custom variables locally in a function
	// with a storage qualifier which is not function-local.
	auto old_storage = var.storage;
	var.storage = StorageClassFunction;
	auto expr = variable_decl(var);
	var.storage = old_storage;
	return expr;
}